

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_FilePathUtils.cpp
# Opt level: O2

String * axl::io::getFullFilePath(String *__return_storage_ptr__,StringRef *fileName)

{
  C *__name;
  char *p;
  char fullPath [4096];
  
  __name = sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::sz(fileName);
  p = realpath(__name,fullPath);
  if (p == (char *)0x0) {
    err::setLastSystemError();
  }
  sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::StringBase
            (__return_storage_ptr__,p,0xffffffffffffffff);
  return __return_storage_ptr__;
}

Assistant:

sl::String
getFullFilePath(const sl::StringRef& fileName) {
#if (_AXL_OS_WIN)
	char buffer[256];
	sl::String_w fileName_w(rc::BufKind_Stack, buffer, sizeof(buffer));
	fileName_w = fileName;

	size_t bufferLength = ::GetFullPathNameW(fileName_w, 0, NULL, NULL);
	if (!bufferLength)
		return err::failWithLastSystemError(NULL);

	sl::String_w filePath;

	for (;;) {
		wchar_t* p = filePath.createBuffer(bufferLength);
		if (!p)
			return NULL;

		size_t actualLength = ::GetFullPathNameW(fileName_w, bufferLength, p, NULL);
		ASSERT(actualLength != bufferLength); // on success, it should be bufferLength - 1

		if (!actualLength)
			return err::failWithLastSystemError(NULL);

		if (actualLength <= bufferLength)
			return sl::String(filePath, actualLength);

		bufferLength = actualLength; // try again with a bigger buffer
	}

#elif (_AXL_OS_POSIX)
	char fullPath[PATH_MAX];
	char* p = ::realpath(fileName.sz(), fullPath);
	return err::complete<char*>(p, NULL);
#endif
}